

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mulhdu(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 rl;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  rl = tcg_temp_new_i64(tcg_ctx);
  uVar1 = ctx->opcode;
  tcg_gen_mulu2_i64_ppc64
            (tcg_ctx,rl,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8)));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(rl + (long)tcg_ctx));
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
  return;
}

Assistant:

static void gen_mulhdu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv lo = tcg_temp_new(tcg_ctx);
    tcg_gen_mulu2_tl(tcg_ctx, lo, cpu_gpr[rD(ctx->opcode)],
                     cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, lo);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}